

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O2

bool __thiscall
google::protobuf::TextFormat::Parser::ParserImpl::ParseField
          (ParserImpl *this,FieldDescriptor *field,Message *output)

{
  bool bVar1;
  CppType CVar2;
  int iVar3;
  undefined4 extraout_var;
  
  CVar2 = FieldDescriptor::cpp_type(field);
  iVar3 = (*(output->super_MessageLite)._vptr_MessageLite[0x16])(output);
  if (CVar2 == CPPTYPE_MESSAGE) {
    bVar1 = ConsumeFieldMessage(this,output,(Reflection *)CONCAT44(extraout_var,iVar3),field);
  }
  else {
    bVar1 = ConsumeFieldValue(this,output,(Reflection *)CONCAT44(extraout_var,iVar3),field);
  }
  if (bVar1 == false) {
    bVar1 = false;
  }
  else {
    bVar1 = (this->tokenizer_).current_.type == TYPE_END;
  }
  return bVar1;
}

Assistant:

bool ParseField(const FieldDescriptor* field, Message* output) {
    bool suc;
    if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      suc = ConsumeFieldMessage(output, output->GetReflection(), field);
    } else {
      suc = ConsumeFieldValue(output, output->GetReflection(), field);
    }
    return suc && LookingAtType(io::Tokenizer::TYPE_END);
  }